

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus debugCompareHighsInfoDouble(string *name,HighsOptions *options,double v0,double v1)

{
  HighsLogOptions *log_options_;
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  HighsDebugStatus return_status;
  HighsLogType report_level;
  string value_adjective;
  double delta;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  double in_stack_ffffffffffffff80;
  HighsDebugStatus local_58;
  uint local_54;
  string local_50 [32];
  HighsLogOptions *local_30;
  long local_18;
  HighsDebugStatus local_4;
  
  if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
    local_18 = in_RSI;
    local_30 = (HighsLogOptions *)
               highsRelativeDifference
                         (in_stack_ffffffffffffff80,
                          (double)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::__cxx11::string::string(local_50);
    local_58 = kOk;
    if ((double)local_30 <= excessive_relative_solution_param_error) {
      if ((double)local_30 <= 1e-12) {
        std::__cxx11::string::operator=(local_50,"OK");
        local_54 = 3;
      }
      else {
        std::__cxx11::string::operator=(local_50,"Large");
        local_54 = 2;
        local_58 = kWarning;
      }
    }
    else {
      std::__cxx11::string::operator=(local_50,"Excessive");
      local_54 = 5;
      local_58 = kError;
    }
    uVar1 = std::__cxx11::string::c_str();
    log_options_ = local_30;
    uVar2 = std::__cxx11::string::c_str();
    highsLogDev(log_options_,(HighsLogType)(local_18 + 0x380),(char *)(ulong)local_54,
                "SolutionPar:  %-9s relative difference of %9.4g for %s\n",uVar1,uVar2);
    local_4 = local_58;
    std::__cxx11::string::~string(local_50);
  }
  else {
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoDouble(const string name,
                                             const HighsOptions& options,
                                             const double v0, const double v1) {
  if (v0 == v1) return HighsDebugStatus::kOk;
  double delta = highsRelativeDifference(v0, v1);
  std::string value_adjective;
  HighsLogType report_level;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  if (delta > excessive_relative_solution_param_error) {
    value_adjective = "Excessive";
    report_level = HighsLogType::kError;
    return_status = HighsDebugStatus::kError;
  } else if (delta > large_relative_solution_param_error) {
    value_adjective = "Large";
    report_level = HighsLogType::kDetailed;
    return_status = HighsDebugStatus::kWarning;
  } else {
    value_adjective = "OK";
    report_level = HighsLogType::kVerbose;
  }
  highsLogDev(options.log_options, report_level,
              "SolutionPar:  %-9s relative difference of %9.4g for %s\n",
              value_adjective.c_str(), delta, name.c_str());
  return return_status;
}